

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# filestream.c
# Opt level: O2

ktx_error_code_e ktxFileStream_skip(ktxStream *str,ktx_size_t count)

{
  int iVar1;
  ktx_error_code_e kVar2;
  ktx_uint32_t i;
  ulong uVar3;
  
  if (str == (ktxStream *)0x0) {
    kVar2 = KTX_INVALID_VALUE;
  }
  else {
    if (str->type != eStreamTypeFile) {
      __assert_fail("str->type == eStreamTypeFile",
                    "/workspace/llm4binary/github/license_c_cmakelists/KhronosGroup[P]KTX-Software/lib/filestream.c"
                    ,0x7c,"ktx_error_code_e ktxFileStream_skip(ktxStream *, const ktx_size_t)");
    }
    uVar3 = 0;
    do {
      if (count <= uVar3) {
        str->readpos = str->readpos + count;
        return KTX_SUCCESS;
      }
      iVar1 = getc((FILE *)(str->data).file);
      uVar3 = (ulong)((int)uVar3 + 1);
    } while (iVar1 != -1);
    iVar1 = feof((FILE *)(str->data).file);
    kVar2 = (uint)(iVar1 != 0) * 2 + KTX_FILE_READ_ERROR;
  }
  return kVar2;
}

Assistant:

static
KTX_error_code ktxFileStream_skip(ktxStream* str, const ktx_size_t count)
{
    if (!str)
        return KTX_INVALID_VALUE;

    assert(str->type == eStreamTypeFile);

    for (ktx_uint32_t i = 0; i < count; i++) {
        int ret = getc(str->data.file);
        if (ret == EOF) {
            if (feof(str->data.file)) {
                return KTX_FILE_UNEXPECTED_EOF;
            } else {
                return KTX_FILE_READ_ERROR;
            }
        }
    }
    str->readpos += count;

    return KTX_SUCCESS;
}